

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O1

bool __thiscall
QFilePrivate::openExternalFile
          (QFilePrivate *this,OpenMode flags,FILE *fh,FileHandleFlags handleFlags)

{
  QAbstractFileEngine *pQVar1;
  int iVar2;
  QAbstractFileEngine *this_00;
  
  this_00 = (QAbstractFileEngine *)operator_new(0x10);
  QFSFileEngine::QFSFileEngine((QFSFileEngine *)this_00);
  pQVar1 = (this->super_QFileDevicePrivate).fileEngine._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  (this->super_QFileDevicePrivate).fileEngine._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = this_00;
  if (pQVar1 != (QAbstractFileEngine *)0x0) {
    (*pQVar1->_vptr_QAbstractFileEngine[1])();
  }
  iVar2 = QFSFileEngine::open((QFSFileEngine *)this_00,
                              flags.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                              super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,(int)fh,
                              (ulong)(uint)handleFlags.
                                           super_QFlagsStorageHelper<QFileDevice::FileHandleFlag,_4>
                                           .super_QFlagsStorage<QFileDevice::FileHandleFlag>.i);
  return SUB41(iVar2,0);
}

Assistant:

bool
QFilePrivate::openExternalFile(QIODevice::OpenMode flags, FILE *fh, QFile::FileHandleFlags handleFlags)
{
#ifdef QT_NO_FSFILEENGINE
    Q_UNUSED(flags);
    Q_UNUSED(fh);
    return false;
#else
    auto fs = std::make_unique<QFSFileEngine>();
    auto fe = fs.get();
    fileEngine = std::move(fs);
    return fe->open(flags, fh, handleFlags);
#endif
}